

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpillPointers.cpp
# Opt level: O0

void __thiscall wasm::SpillPointers::~SpillPointers(SpillPointers *this)

{
  SpillPointers *this_local;
  
  ~SpillPointers(this);
  operator_delete(this,0x378);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }